

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

void __thiscall JsonTest::Runner::listTests(Runner *this)

{
  uint index_00;
  undefined8 uVar1;
  Runner *in_RDI;
  uint index;
  uint count;
  string local_30 [32];
  uint local_10;
  
  index_00 = testCount((Runner *)0x13d938);
  for (local_10 = 0; local_10 < index_00; local_10 = local_10 + 1) {
    testNameAt_abi_cxx11_(in_RDI,index_00);
    uVar1 = std::__cxx11::string::c_str();
    printf("%s\n",uVar1);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Runner::listTests() const {
  unsigned int count = testCount();
  for (unsigned int index = 0; index < count; ++index) {
    printf("%s\n", testNameAt(index).c_str());
  }
}